

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_connect_op.hpp
# Opt level: O2

void asio::detail::
     reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long lVar1;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> handler;
  handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void> w;
  ptr local_90;
  _Any_data local_78;
  long local_68;
  scheduler_operation *local_60;
  scheduler_operation *local_58;
  func_type p_Stack_50;
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  local_48;
  
  local_90.v = (reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)base;
  local_90.p = (reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)base;
  asio::execution::
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  ::any_executor(&local_48,
                 (any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                  *)&base[4].func_);
  local_78._M_unused._M_object = (scheduler_operation *)0x0;
  local_78._8_8_ = (func_type)0x0;
  local_68 = 0;
  local_60 = base[4].next_;
  lVar1 = *(long *)&base[3].task_result_;
  if (lVar1 != 0) {
    local_78._M_unused._M_object = base[3].next_;
    local_78._8_8_ = base[3].func_;
    *(undefined8 *)&base[3].task_result_ = 0;
    base[4].next_ = (scheduler_operation *)0x0;
    local_68 = lVar1;
  }
  local_58 = base[1].next_;
  p_Stack_50 = base[1].func_;
  local_90.h = (function<void_(const_std::error_code_&)> *)&local_78;
  ptr::reset(&local_90);
  if (owner != (void *)0x0) {
    handler_work<std::function<void(std::error_code_const&)>,asio::any_io_executor,void>::
    complete<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>
              ((handler_work<std::function<void(std::error_code_const&)>,asio::any_io_executor,void>
                *)&local_48,
               (binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *)&local_78,
               (function<void_(const_std::error_code_&)> *)&local_78);
  }
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_78);
  asio::execution::detail::any_executor_base::~any_executor_base((any_executor_base *)&local_48);
  ptr::~ptr(&local_90);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    ASIO_ASSUME(base != 0);
    reactive_socket_connect_op* o
      (static_cast<reactive_socket_connect_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(o->handler_, o->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }